

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BinaryExpr<const_debugger_type_&,_const_type_safe::object_ref<debugger_type,_false>_&>::
streamReconstructedExpression
          (BinaryExpr<const_debugger_type_&,_const_type_safe::object_ref<debugger_type,_false>_&>
           *this,ostream *os)

{
  object_ref<debugger_type,_false> *e;
  string *in_R9;
  StringRef op;
  string local_68;
  string *local_48;
  char *pcStack_40;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  BinaryExpr<const_debugger_type_&,_const_type_safe::object_ref<debugger_type,_false>_&> *this_local
  ;
  
  local_18 = os;
  os_local = (ostream *)this;
  Detail::stringify<debugger_type>(&local_38,this->m_lhs);
  local_48 = (string *)(this->m_op).m_start;
  pcStack_40 = (char *)(this->m_op).m_size;
  Detail::stringify<type_safe::object_ref<debugger_type,false>>(&local_68,(Detail *)this->m_rhs,e);
  op.m_size = (size_type)&local_68;
  op.m_start = pcStack_40;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_38,local_48,op,in_R9);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }